

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O0

MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> * __thiscall
vkt::api::anon_unknown_0::CopiesAndBlittingTestInstance::readImage
          (MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>
           *__return_storage_ptr__,CopiesAndBlittingTestInstance *this,VkImage image,
          ImageParms *parms)

{
  bool bVar1;
  TextureLevel *pTVar2;
  PixelBufferAccess local_228;
  VkImage local_200;
  PixelBufferAccess local_1f8;
  PixelBufferAccess local_1d0;
  PixelBufferAccess local_1a8;
  PixelBufferAccess local_180;
  VkImage local_158;
  TextureFormat local_150;
  undefined1 local_148 [8];
  TextureLevel stencilTexture;
  PixelBufferAccess local_f8;
  PixelBufferAccess local_d0;
  PixelBufferAccess local_a8;
  VkImage local_80;
  TextureFormat local_78;
  undefined1 local_70 [8];
  TextureLevel depthTexture;
  TextureFormat local_30;
  TextureFormat imageFormat;
  ImageParms *parms_local;
  CopiesAndBlittingTestInstance *this_local;
  VkImage image_local;
  MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *resultLevel;
  
  imageFormat = (TextureFormat)parms;
  local_30 = ::vk::mapVkFormat(parms->format);
  pTVar2 = (TextureLevel *)operator_new(0x28);
  tcu::TextureLevel::TextureLevel
            (pTVar2,&local_30,*(int *)((long)imageFormat + 8),*(int *)((long)imageFormat + 0xc),
             *(int *)((long)imageFormat + 0x10));
  de::DefaultDeleter<tcu::TextureLevel>::DefaultDeleter
            ((DefaultDeleter<tcu::TextureLevel> *)((long)&depthTexture.m_data.m_cap + 3));
  de::details::MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::MovePtr
            (__return_storage_ptr__,pTVar2);
  bVar1 = tcu::isCombinedDepthStencilType(local_30.type);
  if (bVar1) {
    bVar1 = tcu::hasDepthComponent(local_30.order);
    if (bVar1) {
      local_78 = mapCombinedToDepthTransferFormat(&local_30);
      tcu::TextureLevel::TextureLevel
                ((TextureLevel *)local_70,&local_78,*(int *)((long)imageFormat + 8),
                 *(int *)((long)imageFormat + 0xc),*(int *)((long)imageFormat + 0x10));
      local_80.m_internal = image.m_internal;
      tcu::TextureLevel::getAccess(&local_a8,(TextureLevel *)local_70);
      readImageAspect(this,local_80,&local_a8,(ImageParms *)imageFormat);
      pTVar2 = de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::
               operator->(&__return_storage_ptr__->
                           super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>
                         );
      tcu::TextureLevel::getAccess(&local_f8,pTVar2);
      tcu::getEffectiveDepthStencilAccess(&local_d0,&local_f8,MODE_DEPTH);
      tcu::TextureLevel::getAccess
                ((PixelBufferAccess *)&stencilTexture.m_data.m_cap,(TextureLevel *)local_70);
      tcu::copy((EVP_PKEY_CTX *)&local_d0,(EVP_PKEY_CTX *)&stencilTexture.m_data.m_cap);
      tcu::TextureLevel::~TextureLevel((TextureLevel *)local_70);
    }
    bVar1 = tcu::hasStencilComponent(local_30.order);
    if (bVar1) {
      local_150 = tcu::getEffectiveDepthStencilTextureFormat(&local_30,MODE_STENCIL);
      tcu::TextureLevel::TextureLevel
                ((TextureLevel *)local_148,&local_150,*(int *)((long)imageFormat + 8),
                 *(int *)((long)imageFormat + 0xc),*(int *)((long)imageFormat + 0x10));
      local_158.m_internal = image.m_internal;
      tcu::TextureLevel::getAccess(&local_180,(TextureLevel *)local_148);
      readImageAspect(this,local_158,&local_180,(ImageParms *)imageFormat);
      pTVar2 = de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::
               operator->(&__return_storage_ptr__->
                           super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>
                         );
      tcu::TextureLevel::getAccess(&local_1d0,pTVar2);
      tcu::getEffectiveDepthStencilAccess(&local_1a8,&local_1d0,MODE_STENCIL);
      tcu::TextureLevel::getAccess(&local_1f8,(TextureLevel *)local_148);
      tcu::copy((EVP_PKEY_CTX *)&local_1a8,(EVP_PKEY_CTX *)&local_1f8);
      tcu::TextureLevel::~TextureLevel((TextureLevel *)local_148);
    }
  }
  else {
    local_200.m_internal = image.m_internal;
    pTVar2 = de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::
             operator->(&__return_storage_ptr__->
                         super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>
                       );
    tcu::TextureLevel::getAccess(&local_228,pTVar2);
    readImageAspect(this,local_200,&local_228,(ImageParms *)imageFormat);
  }
  return __return_storage_ptr__;
}

Assistant:

de::MovePtr<tcu::TextureLevel> CopiesAndBlittingTestInstance::readImage	(vk::VkImage		image,
																		 const ImageParms&	parms)
{
	const tcu::TextureFormat		imageFormat	= mapVkFormat(parms.format);
	de::MovePtr<tcu::TextureLevel>	resultLevel	(new tcu::TextureLevel(imageFormat, parms.extent.width, parms.extent.height, parms.extent.depth));

	if (tcu::isCombinedDepthStencilType(imageFormat.type))
	{
		if (tcu::hasDepthComponent(imageFormat.order))
		{
			tcu::TextureLevel	depthTexture	(mapCombinedToDepthTransferFormat(imageFormat), parms.extent.width, parms.extent.height, parms.extent.depth);
			readImageAspect(image, depthTexture.getAccess(), parms);
			tcu::copy(tcu::getEffectiveDepthStencilAccess(resultLevel->getAccess(), tcu::Sampler::MODE_DEPTH), depthTexture.getAccess());
		}

		if (tcu::hasStencilComponent(imageFormat.order))
		{
			tcu::TextureLevel	stencilTexture	(tcu::getEffectiveDepthStencilTextureFormat(imageFormat, tcu::Sampler::MODE_STENCIL), parms.extent.width, parms.extent.height, parms.extent.depth);
			readImageAspect(image, stencilTexture.getAccess(), parms);
			tcu::copy(tcu::getEffectiveDepthStencilAccess(resultLevel->getAccess(), tcu::Sampler::MODE_STENCIL), stencilTexture.getAccess());
		}
	}
	else
		readImageAspect(image, resultLevel->getAccess(), parms);

	return resultLevel;
}